

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::GroupAssignmentRecord
          (GroupAssignmentRecord *this,KUINT32 GroupBitField,EntityIdentifier *ID,KUINT8 DeviceID,
          KUINT8 LineID)

{
  KUINT16 KVar1;
  undefined3 in_register_00000009;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__GroupAssignmentRecord_00232af8
  ;
  this->m_ui32GrpBtField = GroupBitField;
  (this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00220c98;
  KVar1 = (ID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_Entity).super_SimulationIdentifier.m_ui16SiteID =
       (ID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_Entity).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00220c00;
  *(undefined2 *)&(this->m_Entity).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ID->super_SimulationIdentifier).field_0xc;
  this->m_ui16DstCommsDvcID = (KUINT16)CONCAT31(in_register_00000009,DeviceID);
  this->m_ui8DstLineID = LineID;
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

GroupAssignmentRecord::GroupAssignmentRecord( KUINT32 GroupBitField, const EntityIdentifier & ID,
        KUINT8 DeviceID, KUINT8 LineID ) :
    m_ui32GrpBtField( GroupBitField ),
    m_Entity( ID ),
    m_ui16DstCommsDvcID( DeviceID ),
    m_ui8DstLineID( LineID ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}